

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O0

void __thiscall Colony::move_ants(Colony *this)

{
  Node *pNVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Node a;
  Node a_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  bool bVar14;
  ostream *this_00;
  size_type sVar15;
  reference pvVar16;
  reference ppVar17;
  reference pvVar18;
  Graph *in_RDI;
  int x;
  double r;
  double best_v;
  double candi_v;
  int best_idx;
  int candi_idx;
  int i;
  double up_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<double,_std::allocator<double>_> *__range4_1;
  double up;
  pair<int,_int> feasible_edge;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range4;
  double sum;
  vector<double,_std::allocator<double>_> cumulative_sum;
  vector<double,_std::allocator<double>_> probs;
  vector<double,_std::allocator<double>_> ups;
  int next_node_idx;
  int node_idx;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> feasible_edges;
  int car_idx;
  Colony *in_stack_00002550;
  value_type *in_stack_fffffffffffffe08;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  Colony *in_stack_fffffffffffffe20;
  int local_164;
  double local_158;
  int local_144;
  int local_13c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  undefined1 *local_118;
  double local_110;
  pair<int,_int> local_108;
  pair<int,_int> *local_100;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_f8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_f0;
  double local_e8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_b0 [24];
  int local_98;
  int local_94;
  pair<int,_int> local_90;
  value_type *local_88;
  vector<double,_std::allocator<double>_> *pvStack_80;
  undefined8 local_78;
  Colony *pCStack_70;
  value_type *local_58;
  vector<double,_std::allocator<double>_> *pvStack_50;
  undefined8 local_48;
  Colony *pCStack_40;
  int local_2c;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_28;
  int local_c;
  
  local_c = 0;
  do {
    bVar13 = Graph::is_all_visited(in_RDI);
    if (((bVar13 ^ 0xffU) & 1) == 0) break;
    bVar13 = std::vector<Node,_std::allocator<Node>_>::empty
                       ((vector<Node,_std::allocator<Node>_> *)in_stack_fffffffffffffe20);
    uVar4._4_4_ = in_stack_fffffffffffffe1c;
    if (bVar13) {
      Car::add_node((Car *)in_stack_fffffffffffffe20,
                    (Node *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                    (double **)in_stack_fffffffffffffe10);
      uVar4._4_4_ = in_stack_fffffffffffffe1c;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10edb1);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10edbe);
    while( true ) {
      bVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_fffffffffffffe20);
      bVar13 = false;
      if (bVar14) {
        bVar13 = in_RDI->cars[local_c].now_time < 0x4b1;
      }
      if (!bVar13) break;
      for (local_2c = 1; local_2c < in_RDI->num_node; local_2c = local_2c + 1) {
        if ((in_RDI->nodes[local_2c].visited & 1U) == 0) {
          pNVar1 = in_RDI->nodes + local_2c;
          in_stack_fffffffffffffe08 = *(value_type **)pNVar1;
          in_stack_fffffffffffffe10 = *(vector<double,_std::allocator<double>_> **)&pNVar1->idx;
          uVar5 = pNVar1->x;
          uVar6 = pNVar1->y;
          uVar7 = pNVar1->idx;
          uVar8 = pNVar1->demand;
          a.demand = uVar8;
          a.idx = uVar7;
          a.y = uVar6;
          a.x = uVar5;
          pNVar1 = in_RDI->nodes + local_2c;
          uVar3._0_1_ = pNVar1->visited;
          uVar3._1_3_ = *(undefined3 *)&pNVar1->field_0x11;
          uVar3._4_4_ = pNVar1->tw_open;
          in_stack_fffffffffffffe20 = *(Colony **)(&pNVar1->visited + 8);
          in_stack_fffffffffffffe18 = (int)uVar3;
          a._16_4_ = in_stack_fffffffffffffe18;
          a.tw_open = uVar3._4_4_;
          a._24_8_ = in_stack_fffffffffffffe20;
          local_58 = in_stack_fffffffffffffe08;
          pvStack_50 = in_stack_fffffffffffffe10;
          local_48 = uVar3;
          pCStack_40 = in_stack_fffffffffffffe20;
          bVar13 = Car::ok_capacity(in_RDI->cars + local_c,a);
          uVar4._4_4_ = uVar3._4_4_;
          if (bVar13) {
            pNVar1 = in_RDI->nodes + local_2c;
            in_stack_fffffffffffffe08 = *(value_type **)pNVar1;
            in_stack_fffffffffffffe10 = *(vector<double,_std::allocator<double>_> **)&pNVar1->idx;
            uVar9 = pNVar1->x;
            uVar10 = pNVar1->y;
            uVar11 = pNVar1->idx;
            uVar12 = pNVar1->demand;
            a_00.demand = uVar12;
            a_00.idx = uVar11;
            a_00.y = uVar10;
            a_00.x = uVar9;
            pNVar1 = in_RDI->nodes + local_2c;
            uVar4._0_1_ = pNVar1->visited;
            uVar4._1_3_ = *(undefined3 *)&pNVar1->field_0x11;
            uVar4._4_4_ = pNVar1->tw_open;
            in_stack_fffffffffffffe20 = *(Colony **)(&pNVar1->visited + 8);
            in_stack_fffffffffffffe18 = (int)uVar4;
            a_00._16_4_ = in_stack_fffffffffffffe18;
            a_00.tw_open = uVar4._4_4_;
            a_00._24_8_ = in_stack_fffffffffffffe20;
            local_88 = in_stack_fffffffffffffe08;
            pvStack_80 = in_stack_fffffffffffffe10;
            local_78 = uVar4;
            pCStack_70 = in_stack_fffffffffffffe20;
            bVar13 = Car::ok_time(in_RDI->cars + local_c,a_00,in_RDI->distance_matrix);
            if (bVar13) {
              local_90 = std::make_pair<int&,int&>
                                   (&in_stack_fffffffffffffe08->first,(int *)0x10ef90);
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
            }
          }
        }
      }
      bVar13 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_fffffffffffffe20);
      if (bVar13) {
        in_RDI->cars[local_c].now_time = in_RDI->cars[local_c].now_time + 0x1e;
      }
    }
    bVar13 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        in_stack_fffffffffffffe20);
    if (bVar13) {
      if (local_c + 1 < in_RDI->num_car) {
        if (in_RDI->cars[local_c].now_idx != 0) {
          Car::add_node((Car *)in_stack_fffffffffffffe20,
                        (Node *)CONCAT44(uVar4._4_4_,in_stack_fffffffffffffe18),
                        (double **)in_stack_fffffffffffffe10);
        }
        local_c = local_c + 1;
        goto LAB_0010f654;
      }
      this_00 = std::operator<<((ostream *)&std::cout,"cannot visit all customers this step.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_94 = 3;
    }
    else {
      dVar2 = get_rand(in_stack_00002550);
      if (threshold <= dVar2) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x10f17f);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x10f18c);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x10f199);
        local_e8 = 0.0;
        local_f0 = &local_28;
        local_f8._M_current =
             (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        in_stack_fffffffffffffe08);
        local_100 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffe08);
        while (bVar13 = __gnu_cxx::operator!=
                                  ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)in_stack_fffffffffffffe10,
                                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)in_stack_fffffffffffffe08), bVar13) {
          ppVar17 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator*(&local_f8);
          local_108 = *ppVar17;
          local_110 = calc_prob(in_stack_fffffffffffffe20,uVar4._4_4_,in_stack_fffffffffffffe18);
          local_e8 = local_e8 + local_110;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
                     (value_type_conflict1 *)CONCAT44(uVar4._4_4_,in_stack_fffffffffffffe18));
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_f8);
        }
        local_118 = local_b0;
        local_120._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe08);
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe08);
        while (bVar13 = __gnu_cxx::operator!=
                                  ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffe10,
                                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffe08), bVar13) {
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator*(&local_120);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_stack_fffffffffffffe10,(value_type_conflict1 *)in_stack_fffffffffffffe08);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&local_120);
        }
        std::vector<double,_std::allocator<double>_>::front(in_stack_fffffffffffffe10);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
                   (value_type_conflict1 *)CONCAT44(uVar4._4_4_,in_stack_fffffffffffffe18));
        for (local_13c = 0; sVar15 = std::vector<double,_std::allocator<double>_>::size(&local_c8),
            (ulong)(long)local_13c < sVar15 - 1; local_13c = local_13c + 1) {
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_c8,(long)local_13c);
          dVar2 = *pvVar18;
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_c8,(long)(local_13c + 1));
          *pvVar18 = *pvVar18 + dVar2;
          std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)(local_13c + 1));
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
                     (value_type_conflict1 *)CONCAT44(uVar4._4_4_,in_stack_fffffffffffffe18));
        }
        local_158 = INFIN;
        dVar2 = get_rand(in_stack_00002550);
        for (local_164 = 0; sVar15 = std::vector<double,_std::allocator<double>_>::size(&local_e0),
            (ulong)(long)local_164 < sVar15; local_164 = local_164 + 1) {
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_e0,(long)local_164);
          if (dVar2 <= *pvVar18) {
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&local_e0,(long)local_164);
            if (*pvVar18 < local_158) {
              local_144 = local_164;
              local_158 = *pvVar18;
            }
          }
        }
        if ((local_158 != INFIN) || (NAN(local_158) || NAN(INFIN))) {
          pvVar16 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[](&local_28,(long)local_144);
          local_98 = pvVar16->second;
          local_94 = 0;
        }
        else {
          local_94 = 3;
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
        if (local_94 != 0) goto LAB_0010f65f;
      }
      else {
        uVar3._4_4_ = rand();
        sVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           (&local_28);
        pvVar16 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&local_28,(ulong)(long)uVar3._4_4_ % sVar15);
        local_98 = pvVar16->second;
      }
      Car::add_node((Car *)in_stack_fffffffffffffe20,
                    (Node *)CONCAT44(uVar4._4_4_,in_stack_fffffffffffffe18),
                    (double **)in_stack_fffffffffffffe10);
LAB_0010f654:
      local_94 = 0;
    }
LAB_0010f65f:
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe1c = uVar4._4_4_;
  } while (local_94 == 0);
  if (in_RDI->cars[local_c].now_idx != 0) {
    Car::add_node((Car *)in_stack_fffffffffffffe20,
                  (Node *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                  (double **)in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void Colony::move_ants()
{
	int car_idx = 0;
	while(!is_all_visited()){
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] denotes depot
		}
		std::vector< std::pair<int, int> > feasible_edges;
		feasible_edges.clear();
		while (feasible_edges.empty() && cars[car_idx].now_time <= 1200){
			for(int node_idx = 1; node_idx < num_node; node_idx++){
				if(!nodes[node_idx].visited){
					if(cars[car_idx].ok_capacity(nodes[node_idx])){
						if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
							feasible_edges.push_back(std::make_pair(cars[car_idx].now_idx, node_idx));
						}
					}
				}
			}
			if(feasible_edges.empty()){
				cars[car_idx].now_time += 30;// wait for the tw_open at the depot
			}
		}
		
		if(feasible_edges.empty()){// if still edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle			
			}
			else{
				std::cout << "cannot visit all customers this step." << std::endl;
				break;
			}
		}
		else{
			int next_node_idx;
			if (get_rand() < threshold){// choose randomly next node, this prevents local optimization
				next_node_idx = feasible_edges[rand() % feasible_edges.size()].second;
			}
			else{// follow heuristc and pheromone formula, choose next node
				std::vector<double> ups, probs, cumulative_sum;
				double sum = 0.0;
				for (auto feasible_edge : feasible_edges){
					double up = calc_prob(feasible_edge.first, feasible_edge.second);
					sum += up;
					ups.push_back(up);
				}
				for (auto up : ups){
					probs.push_back(up / sum);
				}
				cumulative_sum.push_back(probs.front());
				for (int i = 0; i < probs.size() - 1; i ++){
					probs[i+1] += probs[i];
					cumulative_sum.push_back(probs[i+1]);
				}
				int candi_idx, best_idx;
				double candi_v;
				double best_v = INFIN;
				double r = get_rand();
				for (int x = 0; x < cumulative_sum.size(); x++){
					if (r <= cumulative_sum[x]){
						candi_idx = x;
						candi_v = cumulative_sum[x];
						if (candi_v < best_v){
							best_idx = candi_idx;
							best_v = candi_v;
						}
					}
				}
				if (best_v == INFIN){
						break;
				}
				next_node_idx = feasible_edges[best_idx].second;
				
				// search algorithm
				// double rand = get_rand();
				// // std::sort(cumulative_sum.begin(), cumulative_sum.end());
				// for (auto itr = cumulative_sum.begin(); itr != cumulative_sum.end(); itr++){
				// 	if (rand_num < *itr){
				// 		int next_node_idx = itr;
				// 		break;
				// 	}
				// }
				// auto iter = std::max_element(cumulative_sum.begin(), cumulative_sum.end());
				// next_node_idx = std::distance(cumulative_sum.begin(), iter);// https://teramonagi.hatenablog.com/entry/20130225/1361793892
			}
			cars[car_idx].add_node(&nodes[next_node_idx], distance_matrix);
		}
	}// while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
		cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
}